

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unsupp.cpp
# Opt level: O1

bool ReadUnsupported(MemFile *file,shared_ptr<Disk> *param_2)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  char extraout_AL;
  int iVar4;
  exception *this;
  char *pcVar5;
  bool bVar6;
  string strType;
  undefined4 uStack_98;
  undefined2 uStack_94;
  uint5 *local_90;
  undefined8 local_88;
  uint5 local_80;
  undefined3 uStack_7b;
  uint local_78;
  undefined1 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  MemFile::rewind(file,(FILE *)param_2);
  if (extraout_AL == '\0') {
    return false;
  }
  iVar4 = MemFile::remaining(file);
  if (iVar4 < 0x200) {
    return false;
  }
  plVar1 = (long *)(file->m_it)._M_current;
  lVar2 = *plVar1;
  local_78 = *(uint *)(plVar1 + 1);
  uStack_98 = (undefined4)((ulong)*(undefined8 *)((long)plVar1 + 0x12) >> 0x10);
  uStack_94 = (undefined2)((ulong)*(undefined8 *)((long)plVar1 + 0x12) >> 0x30);
  uVar3 = *(undefined8 *)((long)plVar1 + 0xc);
  (file->m_it)._M_current = (uchar *)(plVar1 + 0x40);
  local_70._M_string_length = 0;
  bVar6 = false;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88 = 0xc;
  local_74 = 0;
  local_90 = &local_80;
  _local_80 = lVar2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar4 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar4 == 0) {
    local_50 = &local_40;
    local_40 = CONCAT44(uStack_98,(int)((ulong)uVar3 >> 0x20));
    local_38 = uStack_94;
    local_48 = 10;
    local_36 = 0;
    iVar4 = std::__cxx11::string::compare((char *)&local_50);
    bVar6 = iVar4 == 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,_local_80 + 1);
  }
  if (bVar6) {
    pcVar5 = "CPCemu";
  }
  else {
    local_88 = 4;
    local_80 = (uint5)(uint)lVar2;
    local_90 = &local_80;
    iVar4 = std::__cxx11::string::compare((char *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,_local_80 + 1);
    }
    if (iVar4 == 0) {
      pcVar5 = "EmuCPC";
    }
    else {
      local_88 = 8;
      local_78 = local_78 & 0xffffff00;
      local_90 = &local_80;
      _local_80 = lVar2;
      iVar4 = std::__cxx11::string::compare((char *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,_local_80 + 1);
      }
      if (iVar4 != 0) goto LAB_001a6964;
      pcVar5 = "CPD";
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_70,0,(char *)local_70._M_string_length,(ulong)pcVar5);
LAB_001a6964:
  if ((char *)local_70._M_string_length == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<std::__cxx11::string&,char_const(&)[41]>
            (this,&local_70,(char (*) [41])" disk images are not currently supported");
  __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadUnsupported(MemFile& file, std::shared_ptr<Disk>&/*disk*/)
{
    std::array<char, SECTOR_SIZE> buf;
    if (!file.rewind() || !file.read(buf))
        return false;

    std::string strType;

    if (std::string(buf.data() + 0x00, 12) == "CPC-Emulator" && std::string(buf.data() + 0x10, 10) == "DiskImageV")
        strType = "CPCemu";
    else if (std::string(buf.data() + 0x00, 4) == "CPCD")
        strType = "EmuCPC";
    else if (std::string(buf.data() + 0x00, 8) == "NORMDISK")
        strType = "CPD";

    if (!strType.empty())
        throw util::exception(strType, " disk images are not currently supported");

    return false;
}